

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_executor.cpp
# Opt level: O2

void __thiscall
duckdb::WindowExecutorLocalState::Finalize
          (WindowExecutorLocalState *this,WindowExecutorGlobalState *gstate,CollectionPtr collection
          )

{
  pointer __p;
  WindowCollection *args;
  column_t range_idx;
  column_t local_28;
  optional_ptr<duckdb::WindowCollection,_true> local_20;
  pointer local_18;
  
  local_28 = gstate->executor->range_idx;
  if (local_28 != 0xffffffffffffffff) {
    local_20.ptr = collection.ptr;
    args = optional_ptr<duckdb::WindowCollection,_true>::operator*(&local_20);
    make_uniq<duckdb::WindowCursor,duckdb::WindowCollection&,unsigned_long_const&>
              ((duckdb *)&local_18,args,&local_28);
    __p = local_18;
    local_18 = (pointer)0x0;
    ::std::__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::reset
              ((__uniq_ptr_impl<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &this->range_cursor,__p);
    ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               &local_18);
  }
  return;
}

Assistant:

void WindowExecutorLocalState::Finalize(WindowExecutorGlobalState &gstate, CollectionPtr collection) {
	const auto range_idx = gstate.executor.range_idx;
	if (range_idx != DConstants::INVALID_INDEX) {
		range_cursor = make_uniq<WindowCursor>(*collection, range_idx);
	}
}